

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-desc.c
# Opt level: O3

void get_mon_name(char *buf,size_t buflen,monster_race *race,player_race *p_race,wchar_t num)

{
  _Bool _Var1;
  char *src;
  
  if (race == (monster_race *)0x0) {
    __assert_fail("race != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-desc.c"
                  ,0x2f,
                  "void get_mon_name(char *, size_t, const struct monster_race *, const struct player_race *, int)"
                 );
  }
  _Var1 = flag_has_dbg(race->flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
  if (_Var1) {
    strnfmt(buf,buflen,"[U] %s, the %s",cave->ghost->name,race->name);
    return;
  }
  _Var1 = flag_has_dbg(race->flags,0xc,1,"race->flags","RF_UNIQUE");
  if (_Var1) {
    strnfmt(buf,buflen,"[U] %s",race->name);
    return;
  }
  strnfmt(buf,buflen,"%3d ",num);
  if (p_race != (player_race *)0x0) {
    my_strcat(buf,p_race->name,buflen);
    my_strcat(buf," ",buflen);
  }
  if (num == L'\x01') {
    src = race->name;
  }
  else {
    src = race->plural;
    if (src == (char *)0x0) {
      my_strcat(buf,race->name,buflen);
      plural_aux(buf,buflen);
      return;
    }
  }
  my_strcat(buf,src,buflen);
  return;
}

Assistant:

void get_mon_name(char *buf, size_t buflen, const struct monster_race *race,
				  const struct player_race *p_race, int num)
{
	assert(race != NULL);

    /* Unique and ghost names don't have a number */
	if (rf_has(race->flags, RF_PLAYER_GHOST)) {
		strnfmt(buf, buflen, "[U] %s, the %s", cave->ghost->name, race->name);
	} else if (rf_has(race->flags, RF_UNIQUE)) {
		strnfmt(buf, buflen, "[U] %s", race->name);
    } else {
	    strnfmt(buf, buflen, "%3d ", num);

	    if (p_race) {
	        my_strcat(buf, p_race->name, buflen);
	        my_strcat(buf, " ", buflen);
		}
	    if (num == 1) {
	        my_strcat(buf, race->name, buflen);
	    } else if (race->plural != NULL) {
	        my_strcat(buf, race->plural, buflen);
	    } else {
	        my_strcat(buf, race->name, buflen);
	        plural_aux(buf, buflen);
	    }
    }
}